

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

void __thiscall cfd::Psbt::SetUtxoData(Psbt *this,UtxoData *utxo,Transaction *transaction)

{
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  OutPoint outpoint;
  Script redeem_script;
  
  cfd::core::OutPoint::OutPoint(&outpoint);
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Script::Script(&redeem_script);
  ConvertFromUtxoData(utxo,&outpoint,(TxOut *)0x0,&key_list,&redeem_script,true,(NetType *)0x0);
  SetTxInUtxo(this,&outpoint,transaction,&redeem_script,&key_list);
  core::Script::~Script(&redeem_script);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&key_list);
  core::Txid::~Txid(&outpoint.txid_);
  return;
}

Assistant:

void Psbt::SetUtxoData(const UtxoData& utxo, const Transaction& transaction) {
  OutPoint outpoint;
  std::vector<KeyData> key_list;
  Script redeem_script;
  ConvertFromUtxoData(
      utxo, &outpoint, nullptr, &key_list, &redeem_script, true);

  SetTxInUtxo(outpoint, transaction, redeem_script, key_list);
}